

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_extraction_by_rapt.cc
# Opt level: O3

bool __thiscall
sptk::PitchExtractionByRapt::Get
          (PitchExtractionByRapt *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<double,_std::allocator<double>_> *epochs,Polarity *polarity)

{
  float fVar1;
  pointer pdVar2;
  pointer pdVar3;
  undefined1 auVar4 [16];
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int tmp_length;
  float *tmp_f0;
  int local_2c;
  float *local_28;
  
  if ((this->is_valid_ == true) &&
     ((waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    if (f0 == (vector<double,_std::allocator<double>_> *)0x0) {
      return true;
    }
    iVar5 = snack::cGet_f0(waveform,this->frame_shift_,this->sampling_rate_,this->lower_f0_,
                           this->upper_f0_,this->voicing_threshold_,&local_28,&local_2c);
    if (iVar5 == 0) {
      lVar6 = (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      lVar7 = lVar6 >> 3;
      auVar11._8_4_ = (int)(lVar6 >> 0x23);
      auVar11._0_8_ = lVar7;
      auVar11._12_4_ = 0x45300000;
      dVar10 = ceil(((auVar11._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) /
                    (double)this->frame_shift_);
      iVar5 = (int)dVar10;
      if (iVar5 < local_2c) {
        local_2c = iVar5;
      }
      std::vector<double,_std::allocator<double>_>::resize(f0,(long)iVar5);
      lVar6 = (long)local_2c;
      pdVar2 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < lVar6) {
        uVar8 = lVar6 + 1;
        lVar7 = 0;
        do {
          *(double *)((long)pdVar2 + lVar7 * 2) = (double)*(float *)((long)local_28 + lVar7);
          uVar8 = uVar8 - 1;
          lVar7 = lVar7 + 4;
        } while (1 < uVar8);
      }
      auVar4 = _DAT_0012bcc0;
      auVar11 = _DAT_0012bcb0;
      pdVar3 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar2 + lVar6 != pdVar3) {
        fVar1 = local_28[lVar6 + -1];
        uVar8 = (long)pdVar3 + (-8 - (long)(pdVar2 + lVar6));
        auVar14._8_4_ = (int)uVar8;
        auVar14._0_8_ = uVar8;
        auVar14._12_4_ = (int)(uVar8 >> 0x20);
        auVar12._0_8_ = uVar8 >> 3;
        auVar12._8_8_ = auVar14._8_8_ >> 3;
        uVar9 = 0;
        auVar12 = auVar12 ^ _DAT_0012bcc0;
        do {
          auVar13._8_4_ = (int)uVar9;
          auVar13._0_8_ = uVar9;
          auVar13._12_4_ = (int)(uVar9 >> 0x20);
          auVar14 = (auVar13 | auVar11) ^ auVar4;
          if ((bool)(~(auVar14._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar14._0_4_ ||
                      auVar12._4_4_ < auVar14._4_4_) & 1)) {
            pdVar2[lVar6 + uVar9] = (double)fVar1;
          }
          if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
              auVar14._12_4_ <= auVar12._12_4_) {
            pdVar2[lVar6 + uVar9 + 1] = (double)fVar1;
          }
          uVar9 = uVar9 + 2;
        } while (((uVar8 >> 3) + 2 & 0xfffffffffffffffe) != uVar9);
      }
      snack::ckfree(local_28);
      return true;
    }
  }
  return false;
}

Assistant:

bool PitchExtractionByRapt::Get(
    const std::vector<double>& waveform, std::vector<double>* f0,
    std::vector<double>* epochs,
    PitchExtractionInterface::Polarity* polarity) const {
  // Check inputs.
  if (!is_valid_ || waveform.empty()) {
    return false;
  }

  if (NULL != f0) {
    float* tmp_f0;
    int tmp_length;
    if (0 != snack::cGet_f0(waveform, frame_shift_, sampling_rate_, lower_f0_,
                            upper_f0_, voicing_threshold_, &tmp_f0,
                            &tmp_length)) {
      return false;
    }
    const int target_length(static_cast<int>(
        std::ceil(static_cast<double>(waveform.size()) / frame_shift_)));
    if (target_length < tmp_length) {
      tmp_length = target_length;
    }
    f0->resize(target_length);
    std::copy(tmp_f0, tmp_f0 + tmp_length, f0->begin());
    std::fill(f0->begin() + tmp_length, f0->end(), tmp_f0[tmp_length - 1]);
    snack::ckfree(tmp_f0);
  }

  if (NULL != epochs) {
    // nothing to do
  }

  if (NULL != polarity) {
    // nothing to do
  }

  return true;
}